

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_cache_client.cpp
# Opt level: O3

void __thiscall cppcms::impl::tcp_cache::stats(tcp_cache *this,uint *keys,uint *triggers)

{
  long lVar1;
  long lVar2;
  string data;
  tcp_operation_header h;
  string local_78;
  tcp_operation_header local_58;
  
  *keys = 0;
  *triggers = 0;
  if (0 < (this->super_tcp_connector).conns) {
    lVar1 = 0;
    lVar2 = 0;
    do {
      local_58.operations.fetch.current_gen = 0;
      local_58.operations.data.timeout = 0;
      local_58.filler[0] = 0;
      local_58.filler[1] = 0;
      local_58.operations._16_8_ = 0;
      local_78._M_string_length = 0;
      local_78.field_2._M_local_buf[0] = '\0';
      local_58.opcode = 4;
      local_58.size = 0;
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      messenger::transmit((messenger *)(&((this->super_tcp_connector).tcp)->field_0x0 + lVar1),
                          &local_58,&local_78);
      if (local_58.opcode == 10) {
        *keys = *keys + local_58.operations.out_stats.keys;
        *triggers = *triggers + local_58.operations.out_stats.triggers;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p);
      }
      lVar2 = lVar2 + 1;
      lVar1 = lVar1 + 0x60;
    } while (lVar2 < (this->super_tcp_connector).conns);
  }
  return;
}

Assistant:

void tcp_cache::stats(unsigned &keys,unsigned &triggers)
{
	keys=0; triggers=0;
	for(int i=0;i<conns;i++) {
		tcp_operation_header h=tcp_operation_header();
		std::string data;
		h.opcode=opcodes::stats;
		tcp[i].transmit(h,data);
		if(h.opcode==opcodes::out_stats) {
			keys+=h.operations.out_stats.keys;
			triggers+=h.operations.out_stats.triggers;
		}
	}
}